

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall DecisionNode::orderPatterns(DecisionNode *this,DecisionProperties *props)

{
  Constructor *pCVar1;
  DisjointPattern *op1;
  DisjointPattern *op2;
  Constructor *b;
  DisjointPattern *this_00;
  int iVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  Constructor *tconst;
  DisjointPattern *tpat;
  bool resolved;
  Constructor *const2;
  Constructor *const1;
  DisjointPattern *pat2;
  DisjointPattern *pat1;
  pair<DisjointPattern_*,_Constructor_*> local_a8;
  Constructor *local_98;
  Constructor *jconst;
  Constructor *iconst;
  DisjointPattern *jpat_1;
  DisjointPattern *ipat_1;
  DisjointPattern *local_68;
  DisjointPattern *jpat;
  DisjointPattern *ipat;
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  conflictlist;
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  newlist;
  int local_20;
  int4 k;
  int4 j;
  int4 i;
  DecisionProperties *props_local;
  DecisionNode *this_local;
  
  std::
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ::vector((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
            *)&conflictlist.
               super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ::vector((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
            *)&ipat);
  for (k = 0; sVar5 = std::
                      vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                      ::size(&this->list), (ulong)(long)k < sVar5; k = k + 1) {
    for (local_20 = 0; local_20 < k; local_20 = local_20 + 1) {
      pvVar6 = std::
               vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ::operator[](&this->list,(long)k);
      jpat = pvVar6->first;
      pvVar6 = std::
               vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ::operator[](&this->list,(long)local_20);
      local_68 = pvVar6->first;
      bVar3 = DisjointPattern::identical(jpat,local_68);
      if (bVar3) {
        pvVar6 = std::
                 vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ::operator[](&this->list,(long)k);
        pCVar1 = pvVar6->second;
        pvVar6 = std::
                 vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ::operator[](&this->list,(long)local_20);
        DecisionProperties::identicalPattern(props,pCVar1,pvVar6->second);
      }
    }
  }
  std::
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ::operator=((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               *)&conflictlist.
                  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->list);
  k = 0;
  do {
    sVar5 = std::
            vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
            ::size(&this->list);
    if (sVar5 <= (ulong)(long)k) {
      k = 0;
      do {
        sVar5 = std::
                vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                ::size((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                        *)&ipat);
        if (sVar5 <= (ulong)(long)k) {
          std::
          vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
          ::~vector((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                     *)&ipat);
          std::
          vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
          ::~vector((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                     *)&conflictlist.
                        super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          return;
        }
        pvVar6 = std::
                 vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ::operator[]((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                               *)&ipat,(long)k);
        op1 = pvVar6->first;
        pvVar6 = std::
                 vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ::operator[]((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                               *)&ipat,(long)k);
        pCVar1 = pvVar6->second;
        pvVar6 = std::
                 vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ::operator[]((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                               *)&ipat,(long)(k + 1));
        op2 = pvVar6->first;
        pvVar6 = std::
                 vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ::operator[]((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                               *)&ipat,(long)(k + 1));
        b = pvVar6->second;
        bVar3 = false;
        for (local_20 = 0;
            sVar5 = std::
                    vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                    ::size(&this->list), (ulong)(long)local_20 < sVar5; local_20 = local_20 + 1) {
          pvVar6 = std::
                   vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                   ::operator[](&this->list,(long)local_20);
          this_00 = pvVar6->first;
          pvVar6 = std::
                   vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                   ::operator[](&this->list,(long)local_20);
          if (((this_00 == op1) && (pvVar6->second == pCVar1)) ||
             ((this_00 == op2 && (pvVar6->second == b)))) break;
          bVar4 = DisjointPattern::resolvesIntersect(this_00,op1,op2);
          if (bVar4) {
            bVar3 = true;
            break;
          }
        }
        if (!bVar3) {
          DecisionProperties::conflictingPattern(props,pCVar1,b);
        }
        k = k + 2;
      } while( true );
    }
    for (local_20 = 0; iVar2 = k, local_20 < k; local_20 = local_20 + 1) {
      pvVar6 = std::
               vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ::operator[]((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                             *)&conflictlist.
                                super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k);
      jpat_1 = pvVar6->first;
      pvVar6 = std::
               vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ::operator[](&this->list,(long)local_20);
      iconst = (Constructor *)pvVar6->first;
      bVar3 = DisjointPattern::specializes(jpat_1,(DisjointPattern *)iconst);
      if (bVar3) break;
      bVar3 = DisjointPattern::specializes((DisjointPattern *)iconst,jpat_1);
      if (!bVar3) {
        pvVar6 = std::
                 vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ::operator[]((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                               *)&conflictlist.
                                  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k);
        jconst = pvVar6->second;
        pvVar6 = std::
                 vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ::operator[](&this->list,(long)local_20);
        local_98 = pvVar6->second;
        if (jconst != local_98) {
          std::pair<DisjointPattern_*,_Constructor_*>::
          pair<DisjointPattern_*&,_Constructor_*&,_true>(&local_a8,&jpat_1,&jconst);
          std::
          vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
          ::push_back((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                       *)&ipat,&local_a8);
          std::pair<DisjointPattern_*,_Constructor_*>::
          pair<DisjointPattern_*&,_Constructor_*&,_true>
                    ((pair<DisjointPattern_*,_Constructor_*> *)&pat1,(DisjointPattern **)&iconst,
                     &local_98);
          std::
          vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
          ::push_back((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                       *)&ipat,(value_type *)&pat1);
        }
      }
    }
    while (newlist.
           super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar2 + -1,
          local_20 <=
          newlist.
          super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
      pvVar6 = std::
               vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ::operator[](&this->list,
                            (long)newlist.
                                  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      pvVar7 = std::
               vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ::operator[](&this->list,(long)iVar2);
      std::pair<DisjointPattern_*,_Constructor_*>::operator=(pvVar7,pvVar6);
      iVar2 = newlist.
              super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    pvVar6 = std::
             vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
             ::operator[]((vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                           *)&conflictlist.
                              super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k);
    pvVar7 = std::
             vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
             ::operator[](&this->list,(long)local_20);
    std::pair<DisjointPattern_*,_Constructor_*>::operator=(pvVar7,pvVar6);
    k = k + 1;
  } while( true );
}

Assistant:

void DecisionNode::orderPatterns(DecisionProperties &props)

{
  // This is a tricky routine.  When this routine is called, the patterns remaining in the
  // the decision node can no longer be distinguished by examining additional bits. The basic
  // idea here is that the patterns should be ordered so that the most specialized should come
  // first in the list. Pattern 1 is a specialization of pattern 2, if the set of instructions
  // matching 1 is contained in the set matching 2.  So in the simplest case, the pattern order
  // should represent a strict nesting.  Unfortunately, there are many potential situations where
  // patterns don't necessarily nest.
  //   1) An "or" of two patterns.  This can be an explicit '|' operator in the Constructor, in
  //      which case this can be detected because the two patterns point to the same constructor
  //      But the "or" can be implied across two constructors that do the same thing.  This should
  //      probably be flagged as an error except in the following case.
  //   2) Two patterns aren't properly nested, but they are "resolved" by a third pattern which
  //      covers the intersection of the first two patterns.  Sometimes its easier to specify
  //      three cases that need to be distinguished in this way.
  //   3) Recursive constructors that use a "guard" context bit.  The guard bit is used to prevent
  //      the recursive constructor from matching repeatedly, but it's too much work to put a
  //      constraint an the bit for every other pattern.
  //   4) Other situations where the ability to distinguish between constructors is hidden in
  //      the subconstructors.
  // This routine can determine if an intersection results from case 1) or case 2)
  int4 i,j,k;
  vector<pair<DisjointPattern *,Constructor *> > newlist;
  vector<pair<DisjointPattern *,Constructor *> > conflictlist;

  // Check for identical patterns
  for(i=0;i<list.size();++i) {
    for(j=0;j<i;++j) {
      DisjointPattern *ipat = list[i].first;
      DisjointPattern *jpat = list[j].first;
      if (ipat->identical(jpat))
	props.identicalPattern(list[i].second,list[j].second);
    }
  }

  newlist = list;
  for(i=0;i<list.size();++i) {
    for(j=0;j<i;++j) {
      DisjointPattern *ipat = newlist[i].first;
      DisjointPattern *jpat = list[j].first;
      if (ipat->specializes(jpat))
	break;
      if (!jpat->specializes(ipat)) { // We have a potential conflict
	Constructor *iconst = newlist[i].second;
	Constructor *jconst = list[j].second;
	if (iconst == jconst) { // This is an OR in the pattern for ONE constructor
	  // So there is no conflict
	}
	else {			// A true conflict that needs to be resolved
	  conflictlist.push_back(pair<DisjointPattern *,Constructor *>(ipat,iconst));
	  conflictlist.push_back(pair<DisjointPattern *,Constructor *>(jpat,jconst));
	}
      }
    }
    for(k=i-1;k>=j;--k)
      list[k+1] = list[k];
    list[j] = newlist[i];
  }
  
  // Check if intersection patterns are present, which resolve conflicts
  for(i=0;i<conflictlist.size();i+=2) {
    DisjointPattern *pat1,*pat2;
    Constructor *const1,*const2;
    pat1 = conflictlist[i].first;
    const1 = conflictlist[i].second;
    pat2 = conflictlist[i+1].first;
    const2 = conflictlist[i+1].second;
    bool resolved = false;
    for(j=0;j<list.size();++j) {
      DisjointPattern *tpat = list[j].first;
      Constructor *tconst = list[j].second;
      if ((tpat == pat1)&&(tconst==const1)) break; // Ran out of possible specializations
      if ((tpat == pat2)&&(tconst==const2)) break;
      if (tpat->resolvesIntersect(pat1,pat2)) {
	resolved = true;
	break;
      }
    }
    if (!resolved)
      props.conflictingPattern(const1,const2);
  }
}